

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O1

wasm_ref_t * wasm_table_get(wasm_table_t *table,wasm_table_size_t index)

{
  Table *this;
  Result RVar1;
  wasm_ref_t *pwVar2;
  Index IVar3;
  Ref ref;
  RefPtr<wabt::interp::Object> local_38;
  Ref local_20;
  
  this = (Table *)(table->super_wasm_extern_t).super_wasm_ref_t.I.obj_;
  if ((this->super_Extern).super_Object.kind_ == Table) {
    RVar1 = wabt::interp::Table::Get(this,index,&local_20);
    if ((RVar1.enum_ == Error) || (local_20.index == 0)) {
      pwVar2 = (wasm_ref_t *)0x0;
    }
    else {
      pwVar2 = (wasm_ref_t *)operator_new(0x18);
      wabt::interp::RefPtr<wabt::interp::Object>::RefPtr
                (&local_38,(table->super_wasm_extern_t).super_wasm_ref_t.I.store_,local_20);
      (pwVar2->I).obj_ = local_38.obj_;
      (pwVar2->I).store_ = local_38.store_;
      if (local_38.store_ == (Store *)0x0) {
        IVar3 = 0;
      }
      else {
        IVar3 = wabt::interp::Store::CopyRoot(local_38.store_,local_38.root_index_);
      }
      (pwVar2->I).root_index_ = IVar3;
      if (local_38.obj_ != (Object *)0x0) {
        wabt::interp::Store::DeleteRoot(local_38.store_,local_38.root_index_);
      }
    }
    return pwVar2;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::Table, Base = wabt::interp::Object]"
               );
}

Assistant:

own wasm_ref_t* wasm_table_get(const wasm_table_t* table,
                               wasm_table_size_t index) {
  Ref ref;
  if (Failed(table->As<Table>()->Get(index, &ref))) {
    return nullptr;
  }
  if (ref == Ref::Null) {
    return nullptr;
  }
  return new wasm_ref_t{table->I.store()->UnsafeGet<Object>(ref)};
}